

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
               *this,GetterYs<int> *getter1,GetterYRef *getter2,TransformerLogLin *transformer,
              ImU32 col)

{
  double dVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  GetterYRef *pGVar4;
  TransformerLogLin *pTVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  double dVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  int iVar11;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar11 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar11 = iVar2;
  }
  this->Prims = iVar11 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar10 = GImPlot;
  (this->P12).y = 0.0;
  iVar2 = *(int *)((long)getter1->Ys +
                  (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride);
  dVar8 = log10((getter1->XScale * 0.0 + getter1->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar10->CurrentPlot;
  dVar1 = (pIVar3->XAxis).Range.Min;
  iVar11 = transformer->YAxis;
  IVar6.y = (float)(((double)iVar2 - pIVar3->YAxis[iVar11].Range.Min) * pIVar10->My[iVar11] +
                   (double)pIVar10->PixelRange[iVar11].Min.y);
  IVar6.x = (float)((((double)(float)(dVar8 / pIVar10->LogDenX) *
                      ((pIVar3->XAxis).Range.Max - dVar1) + dVar1) - dVar1) * pIVar10->Mx +
                   (double)pIVar10->PixelRange[iVar11].Min.x);
  this->P11 = IVar6;
  pIVar10 = GImPlot;
  pGVar4 = this->Getter2;
  pTVar5 = this->Transformer;
  dVar1 = pGVar4->YRef;
  dVar9 = log10((pGVar4->XScale * 0.0 + pGVar4->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar10->CurrentPlot;
  dVar8 = (pIVar3->XAxis).Range.Min;
  iVar2 = pTVar5->YAxis;
  IVar7.y = (float)((dVar1 - pIVar3->YAxis[iVar2].Range.Min) * pIVar10->My[iVar2] +
                   (double)pIVar10->PixelRange[iVar2].Min.y);
  IVar7.x = (float)((((double)(float)(dVar9 / pIVar10->LogDenX) *
                      ((pIVar3->XAxis).Range.Max - dVar8) + dVar8) - dVar8) * pIVar10->Mx +
                   (double)pIVar10->PixelRange[iVar2].Min.x);
  this->P12 = IVar7;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }